

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

JsonToken * __thiscall Corrade::Utility::JsonToken::firstChild(JsonToken *this)

{
  JsonToken *this_local;
  
  if (((((this->_sizeFlagsParsedTypeType & 0xe000000000000000) == 0x2000000000000000) ||
       ((this->_sizeFlagsParsedTypeType & 0xe000000000000000) == 0x4000000000000000)) &&
      ((this->field_2)._childCount != 0)) ||
     ((this->_sizeFlagsParsedTypeType & 0x200000000000000) != 0)) {
    this_local = this + 1;
  }
  else {
    this_local = (JsonToken *)0x0;
  }
  return this_local;
}

Assistant:

inline const JsonToken* JsonToken::firstChild() const {
    #ifndef CORRADE_TARGET_32BIT
    /* The token has a child if it's an object or an array and has children */
    if((((_sizeFlagsParsedTypeType & TypeMask) == TypeObject ||
         (_sizeFlagsParsedTypeType & TypeMask) == TypeArray) && _childCount) ||
        /* or if it's an object key */
        (_sizeFlagsParsedTypeType & FlagStringKey))
        return this + 1;
    #else
    /* The token has a child if it's not a parsed number and */
    if(((_childCountFlagsTypeNan & (NanMask|SignMask)) == NanMask) &&
      /* it's an object with non-zero child count */
    ((((_childCountFlagsTypeNan & TypeMask) == TypeObject ||
       (_childCountFlagsTypeNan & TypeMask) == TypeArray) &&
       (_childCountFlagsTypeNan & ChildCountMask)) ||
       /* or it's an object key */
       (_childCountFlagsTypeNan & FlagStringKey)))
        return this + 1;
    #endif
    return nullptr;
}